

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O2

int AF_A_FAxeCheckReadyG(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *player;
  AWeapon *this_00;
  bool bVar2;
  AAmmo *pAVar3;
  FState *state;
  AActor *self;
  char *__assertion;
  FName local_24;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005384e2;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_005383df:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005384e2;
        }
      }
      if (numparam == 1) goto LAB_0053845f;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005384d2;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005384e2;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005384d2;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053845f:
        player = self->player;
        if (player != (player_t *)0x0) {
          pAVar3 = GC::ReadBarrier<AAmmo>((AAmmo **)&player->ReadyWeapon->Ammo1);
          if ((pAVar3->super_AInventory).Amount < 1) {
            this_00 = player->ReadyWeapon;
            FName::FName(&local_24,"Ready");
            state = AActor::FindState((AActor *)this_00,&local_24);
            P_SetPsprite(player,PSP_WEAPON,state,false);
          }
          else {
            DoReadyWeapon(self);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005384e2;
    }
    if (self == (AActor *)0x0) goto LAB_005383df;
  }
LAB_005384d2:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005384e2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0x60,"int AF_A_FAxeCheckReadyG(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckReadyG)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount <= 0)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("Ready"));
	}
	else
	{
		DoReadyWeapon(self);
	}
	return 0;
}